

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

ON_SubD_ComponentIdTypeAndTag ON_SubD_ComponentIdTypeAndTag::CreateFromEdge(ON_SubDEdgePtr eptr)

{
  ON_SubDEdgeTag OVar1;
  byte bVar2;
  undefined8 uVar3;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  ON_SubD_ComponentIdTypeAndTag OVar4;
  ON_SubD_ComponentIdTypeAndTag itt;
  ON_SubD_ComponentIdTypeAndTag local_38;
  undefined1 local_28 [16];
  
  OVar4 = CreateFromEdge((ON_SubDEdge *)(eptr.m_ptr & 0xfffffffffffffff8));
  local_38.m_sharpness = OVar4.m_sharpness.m_edge_sharpness;
  local_28._8_4_ = extraout_XMM0_Dc;
  local_28._0_4_ = local_38.m_sharpness.m_edge_sharpness[0];
  local_28._4_4_ = local_38.m_sharpness.m_edge_sharpness[1];
  local_28._12_4_ = extraout_XMM0_Dd;
  local_38._8_8_ = OVar4._8_8_;
  OVar1 = EdgeTag(&local_38);
  uVar3 = OVar4._8_8_;
  if (OVar1 != Unset) {
    bVar2 = 0x70;
    if ((eptr.m_ptr & 1) == 0) {
      bVar2 = 0;
    }
    local_38.m_tag_and_dirx = bVar2 | OVar4.m_tag_and_dirx & 7;
    uVar3 = local_38._8_8_;
  }
  OVar4.m_id = (uint)uVar3;
  OVar4.m_type = SUB81(uVar3,4);
  OVar4.m_tag_and_dirx = SUB81(uVar3,5);
  OVar4.m_reserved = SUB82(uVar3,6);
  OVar4.m_sharpness.m_edge_sharpness[0] = (float)local_28._0_4_;
  OVar4.m_sharpness.m_edge_sharpness[1] = (float)local_28._4_4_;
  return OVar4;
}

Assistant:

const ON_SubD_ComponentIdTypeAndTag ON_SubD_ComponentIdTypeAndTag::CreateFromEdge(const class ON_SubDEdgePtr eptr)
{
  ON_SubD_ComponentIdTypeAndTag itt = ON_SubD_ComponentIdTypeAndTag::CreateFromEdge(eptr.Edge());
  if (ON_SubDEdgeTag::Unset != itt.EdgeTag())
    itt.Internal_SetDir(0 == eptr.EdgeDirection() ? 0 : 1);
  return itt;
}